

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> __thiscall
amrex::MultiFab::OverlapMask(MultiFab *this,Periodicity *period)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FabArray<amrex::FArrayBox> *this_00;
  FArrayBox *pFVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer ppVar9;
  pointer pIVar10;
  int iVar11;
  Periodicity *in_RDX;
  void *__s;
  pair<int,_amrex::Box> *is;
  pointer pbVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  IntVect *v;
  int iVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> tags;
  MFIter mfi;
  undefined1 local_158 [32];
  _Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_138;
  BoxArray *local_120;
  Box *local_118;
  long local_110;
  long local_108;
  Array4<double> local_100;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_c0;
  undefined1 local_a8 [16];
  pointer local_98;
  undefined1 local_90 [16];
  undefined1 auStack_80 [16];
  int iStack_70;
  int local_68;
  Vector<int,_std::allocator<int>_> *local_50;
  
  local_120 = (BoxArray *)((period->period).vect + 2);
  local_158._0_8_ = local_158._0_8_ & 0xffffffff00000000;
  local_100.p._0_4_ = 1;
  local_90._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  stack0xffffffffffffff78 = (undefined1  [16])0x0;
  stack0xffffffffffffff88 = (undefined1  [16])0x0;
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
            ((BoxArray *)this,(DistributionMapping *)local_120,period[9].period.vect + 1,
             (int *)&local_100,(MFInfo *)local_158,(FabFactory<amrex::FArrayBox> *)local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_80);
  Periodicity::shiftIntVect
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_c0,in_RDX);
  local_a8 = (undefined1  [16])0x0;
  local_98 = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MFIter::MFIter((MFIter *)local_90,
                 (FabArrayBase *)
                 (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase,'\0'
                );
  while (iStack_70 < local_68) {
    iVar11 = iStack_70;
    if (local_50 != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar11 = (local_50->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[iStack_70];
    }
    this_00 = (FabArray<amrex::FArrayBox> *)
              (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase;
    pFVar5 = (this_00->m_fabs_v).
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar11];
    local_118 = &(pFVar5->super_BaseFab<double>).domain;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_100,this_00,(MFIter *)local_90);
    iVar11 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
    iVar1 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 4);
    iVar2 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[0];
    iVar3 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.bigend + 4);
    iVar4 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.bigend + 8);
    local_108 = (long)iVar11 << 3;
    local_110 = (long)iVar1;
    for (iVar13 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 8);
        pIVar10 = local_c0._M_impl.super__Vector_impl_data._M_finish,
        v = local_c0._M_impl.super__Vector_impl_data._M_start, iVar13 <= iVar4; iVar13 = iVar13 + 1)
    {
      lVar17 = local_100.jstride * 8;
      __s = (void *)((local_110 - local_100.begin.y) * lVar17 +
                     (iVar13 - local_100.begin.z) * local_100.kstride * 8 +
                     (long)local_100.begin.x * -8 +
                    CONCAT44(local_100.p._4_4_,local_100.p._0_4_) + local_108);
      for (iVar19 = iVar1; iVar19 <= iVar3; iVar19 = iVar19 + 1) {
        if (iVar11 <= iVar2) {
          memset(__s,0,(ulong)(uint)(iVar2 - iVar11) * 8 + 8);
        }
        __s = (void *)((long)__s + lVar17);
      }
    }
    for (; v != pIVar10; v = v + 1) {
      local_158._0_8_ = *(undefined8 *)(local_118->smallend).vect;
      uVar6 = *(undefined8 *)((local_118->smallend).vect + 2);
      local_158._20_8_ = *(undefined8 *)((local_118->bigend).vect + 2);
      local_158._16_4_ = (undefined4)((ulong)*(undefined8 *)(local_118->bigend).vect >> 0x20);
      local_158._8_4_ = (undefined4)uVar6;
      local_158._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      Box::operator+=((Box *)local_158,v);
      BoxArray::intersections
                (local_120,(Box *)local_158,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )&local_138);
      ppVar9 = local_138._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar12 = (pointer)local_138._M_impl.super__Vector_impl_data._M_start;
          pbVar12 != (pointer)ppVar9; pbVar12 = pbVar12 + 1) {
        local_158._0_8_ = *(ulong *)((long)&(pbVar12->_M_dataplus)._M_p + 4);
        uVar6 = *(undefined8 *)((long)&pbVar12->_M_string_length + 4);
        local_158._20_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
        local_158._16_4_ = (undefined4)((pbVar12->field_2)._M_allocated_capacity >> 0x20);
        local_158._8_4_ = (undefined4)uVar6;
        local_158._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        Box::operator-=((Box *)local_158,v);
        auVar8 = _DAT_006f8e90;
        auVar7 = _DAT_006f8e80;
        lVar15 = (long)(int)local_158._8_4_;
        uVar18 = local_158._12_4_ - local_158._0_4_;
        auVar21._4_4_ = 0;
        auVar21._0_4_ = uVar18;
        auVar21._8_4_ = uVar18;
        auVar21._12_4_ = 0;
        lVar17 = CONCAT44(local_100.p._4_4_,local_100.p._0_4_) +
                 ((long)(int)local_158._4_4_ - (long)local_100.begin.y) * local_100.jstride * 8 +
                 (lVar15 - local_100.begin.z) * local_100.kstride * 8 +
                 (long)(int)local_158._0_4_ * 8 + (long)local_100.begin.x * -8 + 8;
        auVar21 = auVar21 ^ _DAT_006f8e90;
        for (; lVar14 = (long)(int)local_158._4_4_, lVar16 = lVar17, lVar15 <= (int)local_158._20_4_
            ; lVar15 = lVar15 + 1) {
          for (; lVar14 <= (int)local_158._16_4_; lVar14 = lVar14 + 1) {
            if ((int)local_158._0_4_ <= (int)local_158._12_4_) {
              uVar20 = 0;
              do {
                auVar22._8_4_ = (int)uVar20;
                auVar22._0_8_ = uVar20;
                auVar22._12_4_ = (int)(uVar20 >> 0x20);
                auVar22 = (auVar22 | auVar7) ^ auVar8;
                if ((bool)(~(auVar21._4_4_ < auVar22._4_4_ ||
                            auVar21._0_4_ < auVar22._0_4_ && auVar22._4_4_ == auVar21._4_4_) & 1)) {
                  *(double *)(lVar16 + -8 + uVar20 * 8) =
                       *(double *)(lVar16 + -8 + uVar20 * 8) + 1.0;
                }
                if (auVar22._12_4_ <= auVar21._12_4_ &&
                    (auVar22._8_4_ <= auVar21._8_4_ || auVar22._12_4_ != auVar21._12_4_)) {
                  *(double *)(lVar16 + uVar20 * 8) = *(double *)(lVar16 + uVar20 * 8) + 1.0;
                }
                uVar20 = uVar20 + 2;
              } while (((ulong)uVar18 + 2 & 0xfffffffffffffffe) != uVar20);
            }
            lVar16 = lVar16 + local_100.jstride * 8;
          }
          lVar17 = lVar17 + local_100.kstride * 8;
        }
      }
    }
    MFIter::operator++((MFIter *)local_90);
  }
  MFIter::~MFIter((MFIter *)local_90);
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base(&local_138);
  std::_Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::
  ~_Vector_base((_Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>
                 *)local_a8);
  std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base(&local_c0);
  return (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
         (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)this;
}

Assistant:

std::unique_ptr<MultiFab>
MultiFab::OverlapMask (const Periodicity& period) const
{
    BL_PROFILE("MultiFab::OverlapMask()");

    const BoxArray& ba = boxArray();
    const DistributionMapping& dm = DistributionMap();

    auto p = std::make_unique<MultiFab>(ba,dm,1,0, MFInfo(), Factory());

    const std::vector<IntVect>& pshifts = period.shiftIntVect();

    Vector<Array4BoxTag<Real> > tags;

    bool run_on_gpu = Gpu::inLaunchRegion();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        std::vector< std::pair<int,Box> > isects;

        for (MFIter mfi(*p); mfi.isValid(); ++mfi)
        {
            const Box& bx = (*p)[mfi].box();
            Array4<Real> const& arr = p->array(mfi);

            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                arr(i,j,k) = Real(0.0);
            });

            for (const auto& iv : pshifts)
            {
                ba.intersections(bx+iv, isects);
                for (const auto& is : isects)
                {
                    Box const& b = is.second-iv;
                    if (run_on_gpu) {
                        tags.push_back({arr,b});
                    } else {
                        amrex::LoopConcurrentOnCpu(b, [=] (int i, int j, int k) noexcept
                        {
                            arr(i,j,k) += Real(1.0);
                        });
                    }
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    amrex::ParallelFor(tags, 1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n, Array4BoxTag<Real> const& tag) noexcept
    {
        Real* p = tag.dfab.ptr(i,j,k,n);
        Gpu::Atomic::AddNoRet(p, Real(1.0));
    });
#endif

    return p;
}